

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  size_t sVar1;
  ZSTD_cpuid_t ZVar2;
  ZSTD_CCtx local_408;
  
  ZVar2 = ZSTD_cpuid();
  memset(&local_408,0,0x3d8);
  local_408.requestedParams.format = ZSTD_f_zstd1;
  local_408.requestedParams.cParams.windowLog = 0;
  local_408.requestedParams.cParams.chainLog = 0;
  local_408.requestedParams.cParams.hashLog = 0;
  local_408.requestedParams.cParams.searchLog = 0;
  local_408.requestedParams.cParams.minMatch = 0;
  local_408.requestedParams.cParams.targetLength = 0;
  local_408.requestedParams.cParams.strategy = 0;
  local_408.requestedParams.forceWindow = 0;
  local_408.requestedParams.attachDictPref = ZSTD_dictDefaultAttach;
  local_408.requestedParams.nbWorkers = 0;
  local_408.requestedParams._60_4_ = 0;
  local_408.requestedParams.jobSize = 0;
  local_408.requestedParams.overlapLog = 0;
  local_408.requestedParams.rsyncable = 0;
  local_408.requestedParams.ldmParams.enableLdm = 0;
  local_408.requestedParams.ldmParams.hashLog = 0;
  local_408.requestedParams.ldmParams.bucketSizeLog = 0;
  local_408.requestedParams.ldmParams.minMatchLength = 0;
  local_408.requestedParams.ldmParams.hashRateLog = 0;
  local_408.requestedParams.ldmParams.windowLog = 0;
  local_408.requestedParams.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  local_408.requestedParams.customMem.customFree = (ZSTD_freeFunction)0x0;
  local_408.requestedParams.customMem.opaque = (void *)0x0;
  local_408.requestedParams.fParams.noDictIDFlag = 0;
  local_408.requestedParams.compressionLevel = 3;
  local_408.requestedParams.fParams.contentSizeFlag = 1;
  local_408.requestedParams.fParams.checksumFlag = 0;
  local_408.bmi2 = ZVar2._1_4_ & 1;
  sVar1 = ZSTD_compressCCtx(&local_408,dst,dstCapacity,src,srcSize,compressionLevel);
  ZSTD_freeCCtxContent(&local_408);
  return sVar1;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity,
               const void* src, size_t srcSize,
                     int compressionLevel)
{
    size_t result;
    ZSTD_CCtx ctxBody;
    ZSTD_initCCtx(&ctxBody, ZSTD_defaultCMem);
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_freeCCtxContent(&ctxBody);   /* can't free ctxBody itself, as it's on stack; free only heap content */
    return result;
}